

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Name> *
wasm::WATParser::tableidx<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  Name *u;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  undefined1 local_68 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> idx;
  ParseDefsCtx *ctx_local;
  
  maybeTableidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  if (bVar1) {
    MaybeResult<wasm::Name>::MaybeResult
              ((MaybeResult<wasm::Name> *)local_68,
               (MaybeResult<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    local_80 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_68);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Name>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_68);
    if (local_a4 == 0) {
      u = MaybeResult<wasm::Name>::operator*
                    ((MaybeResult<wasm::Name> *)
                     ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
      Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,u);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  if (local_a4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected table index or identifier",&local_e9);
    Lexer::err(&local_c8,&ctx->in,&local_e8);
    Result<wasm::Name>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableIdxT> tableidx(Ctx& ctx) {
  if (auto idx = maybeTableidx(ctx)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected table index or identifier");
}